

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DebugHookIdInfo(ImGuiID id,ImGuiDataType data_type,void *data_id,void *data_id_end)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  ImGuiWindow *pIVar4;
  ImGuiStackLevelInfo *pIVar5;
  bool bVar6;
  ImGuiContext *pIVar7;
  ImGuiStackLevelInfo *__dest;
  long lVar8;
  size_t sVar9;
  uint uVar10;
  ulong uVar11;
  char *pcVar12;
  long lVar13;
  ImGuiContext *ctx;
  int iVar14;
  int iVar15;
  
  pIVar7 = GImGui;
  uVar11 = (ulong)id;
  pIVar4 = GImGui->CurrentWindow;
  iVar2 = (GImGui->DebugStackTool).StackLevel;
  lVar13 = (long)iVar2;
  if (lVar13 == -1) {
    (GImGui->DebugStackTool).StackLevel = 0;
    iVar15 = (pIVar4->IDStack).Size;
    iVar2 = iVar15 + 1;
    iVar3 = (pIVar7->DebugStackTool).Results.Capacity;
    if (iVar3 <= iVar15) {
      if (iVar3 == 0) {
        iVar14 = 8;
      }
      else {
        iVar14 = iVar3 / 2 + iVar3;
      }
      if (iVar14 <= iVar2) {
        iVar14 = iVar2;
      }
      if (iVar3 < iVar14) {
        if (pIVar7 != (ImGuiContext *)0x0) {
          piVar1 = &(pIVar7->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        __dest = (ImGuiStackLevelInfo *)
                 (*GImAllocatorAllocFunc)((long)iVar14 << 6,GImAllocatorUserData);
        pIVar5 = (pIVar7->DebugStackTool).Results.Data;
        if (pIVar5 != (ImGuiStackLevelInfo *)0x0) {
          memcpy(__dest,pIVar5,(long)(pIVar7->DebugStackTool).Results.Size << 6);
          pIVar5 = (pIVar7->DebugStackTool).Results.Data;
          if ((pIVar5 != (ImGuiStackLevelInfo *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar5,GImAllocatorUserData);
        }
        (pIVar7->DebugStackTool).Results.Data = __dest;
        (pIVar7->DebugStackTool).Results.Capacity = iVar14;
      }
    }
    iVar3 = (pIVar7->DebugStackTool).Results.Size;
    if (iVar3 <= iVar15) {
      iVar15 = (iVar15 - iVar3) + 1;
      lVar13 = (long)iVar3 << 6;
      do {
        pIVar5 = (pIVar7->DebugStackTool).Results.Data;
        pcVar12 = pIVar5->Desc + lVar13 + 0x29;
        pcVar12[0] = '\0';
        pcVar12[1] = '\0';
        pcVar12[2] = '\0';
        pcVar12[3] = '\0';
        pcVar12[4] = '\0';
        pcVar12[5] = '\0';
        pcVar12[6] = '\0';
        pcVar12[7] = '\0';
        pcVar12[8] = '\0';
        pcVar12[9] = '\0';
        pcVar12[10] = '\0';
        pcVar12[0xb] = '\0';
        pcVar12[0xc] = '\0';
        pcVar12[0xd] = '\0';
        pcVar12[0xe] = '\0';
        pcVar12[0xf] = '\0';
        pcVar12 = pIVar5->Desc + lVar13 + 0x19;
        pcVar12[0] = '\0';
        pcVar12[1] = '\0';
        pcVar12[2] = '\0';
        pcVar12[3] = '\0';
        pcVar12[4] = '\0';
        pcVar12[5] = '\0';
        pcVar12[6] = '\0';
        pcVar12[7] = '\0';
        pcVar12[8] = '\0';
        pcVar12[9] = '\0';
        pcVar12[10] = '\0';
        pcVar12[0xb] = '\0';
        pcVar12[0xc] = '\0';
        pcVar12[0xd] = '\0';
        pcVar12[0xe] = '\0';
        pcVar12[0xf] = '\0';
        pcVar12 = pIVar5->Desc + lVar13 + 9;
        pcVar12[0] = '\0';
        pcVar12[1] = '\0';
        pcVar12[2] = '\0';
        pcVar12[3] = '\0';
        pcVar12[4] = '\0';
        pcVar12[5] = '\0';
        pcVar12[6] = '\0';
        pcVar12[7] = '\0';
        pcVar12[8] = '\0';
        pcVar12[9] = '\0';
        pcVar12[10] = '\0';
        pcVar12[0xb] = '\0';
        pcVar12[0xc] = '\0';
        pcVar12[0xd] = '\0';
        pcVar12[0xe] = '\0';
        pcVar12[0xf] = '\0';
        pcVar12 = pIVar5->Desc + lVar13 + -7;
        pcVar12[0] = '\0';
        pcVar12[1] = '\0';
        pcVar12[2] = '\0';
        pcVar12[3] = '\0';
        pcVar12[4] = '\0';
        pcVar12[5] = '\0';
        pcVar12[6] = '\0';
        pcVar12[7] = '\0';
        pcVar12[8] = '\0';
        pcVar12[9] = '\0';
        pcVar12[10] = '\0';
        pcVar12[0xb] = '\0';
        pcVar12[0xc] = '\0';
        pcVar12[0xd] = '\0';
        pcVar12[0xe] = '\0';
        pcVar12[0xf] = '\0';
        lVar13 = lVar13 + 0x40;
        iVar15 = iVar15 + -1;
      } while (iVar15 != 0);
    }
    (pIVar7->DebugStackTool).Results.Size = iVar2;
    uVar10 = (pIVar4->IDStack).Size;
    uVar11 = (ulong)uVar10;
    if ((int)uVar10 < 0) {
      return;
    }
    lVar8 = 0;
    lVar13 = 0;
    do {
      uVar10 = id;
      if (lVar13 < (int)uVar11) {
        uVar10 = (pIVar4->IDStack).Data[lVar13];
      }
      *(uint *)(((pIVar7->DebugStackTool).Results.Data)->Desc + lVar8 + -7) = uVar10;
      uVar11 = (ulong)(pIVar4->IDStack).Size;
      lVar8 = lVar8 + 0x40;
      bVar6 = lVar13 < (long)uVar11;
      lVar13 = lVar13 + 1;
    } while (bVar6);
    return;
  }
  if (iVar2 != (pIVar4->IDStack).Size) {
    return;
  }
  pIVar5 = (GImGui->DebugStackTool).Results.Data;
  switch(data_type) {
  case 4:
    pcVar12 = "%d";
    uVar11 = (ulong)data_id & 0xffffffff;
    goto LAB_001e7c61;
  case 0xb:
    if (data_id_end == (void *)0x0) {
      sVar9 = strlen((char *)data_id);
    }
    else {
      sVar9 = (long)data_id_end - (long)data_id;
    }
    ImFormatString(pIVar5[lVar13].Desc,0x39,"%.*s",sVar9,data_id);
    break;
  case 0xc:
    ImFormatString(pIVar5[lVar13].Desc,0x39,"(void*)0x%p",data_id);
    break;
  case 0xd:
    if (pIVar5[lVar13].Desc[0] != '\0') {
      return;
    }
    pcVar12 = "0x%08X [override]";
LAB_001e7c61:
    ImFormatString(pIVar5[lVar13].Desc,0x39,pcVar12,uVar11);
  }
  pIVar5[lVar13].QuerySuccess = true;
  pIVar5[lVar13].field_0x6 = (char)data_type;
  return;
}

Assistant:

void ImGui::DebugHookIdInfo(ImGuiID id, ImGuiDataType data_type, const void* data_id, const void* data_id_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiStackTool* tool = &g.DebugStackTool;

    // Step 0: stack query
    // This assumes that the ID was computed with the current ID stack, which tends to be the case for our widget.
    if (tool->StackLevel == -1)
    {
        tool->StackLevel++;
        tool->Results.resize(window->IDStack.Size + 1, ImGuiStackLevelInfo());
        for (int n = 0; n < window->IDStack.Size + 1; n++)
            tool->Results[n].ID = (n < window->IDStack.Size) ? window->IDStack[n] : id;
        return;
    }

    // Step 1+: query for individual level
    IM_ASSERT(tool->StackLevel >= 0);
    if (tool->StackLevel != window->IDStack.Size)
        return;
    ImGuiStackLevelInfo* info = &tool->Results[tool->StackLevel];
    IM_ASSERT(info->ID == id && info->QueryFrameCount > 0);

    switch (data_type)
    {
    case ImGuiDataType_S32:
        ImFormatString(info->Desc, IM_ARRAYSIZE(info->Desc), "%d", (int)(intptr_t)data_id);
        break;
    case ImGuiDataType_String:
        ImFormatString(info->Desc, IM_ARRAYSIZE(info->Desc), "%.*s", data_id_end ? (int)((const char*)data_id_end - (const char*)data_id) : (int)strlen((const char*)data_id), (const char*)data_id);
        break;
    case ImGuiDataType_Pointer:
        ImFormatString(info->Desc, IM_ARRAYSIZE(info->Desc), "(void*)0x%p", data_id);
        break;
    case ImGuiDataType_ID:
        if (info->Desc[0] != 0) // PushOverrideID() is often used to avoid hashing twice, which would lead to 2 calls to DebugHookIdInfo(). We prioritize the first one.
            return;
        ImFormatString(info->Desc, IM_ARRAYSIZE(info->Desc), "0x%08X [override]", id);
        break;
    default:
        IM_ASSERT(0);
    }
    info->QuerySuccess = true;
    info->DataType = data_type;
}